

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::ModuleDeclarationSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((kind != InterfaceDeclaration) && (kind != ModuleDeclaration)) &&
      (kind != PackageDeclaration)) && (kind != ProgramDeclaration)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ModuleDeclarationSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::PackageDeclaration:
        case SyntaxKind::ProgramDeclaration:
            return true;
        default:
            return false;
    }
}